

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.hpp
# Opt level: O0

void __thiscall
Amiga::Chipset::perform<CPU::MC68000::Microcycle<96u>>(Chipset *this,Microcycle<96U> *cycle)

{
  uint16_t uVar1;
  uint __fd;
  ssize_t sVar2;
  size_t in_RCX;
  uint32_t register_address;
  Microcycle<96U> *cycle_local;
  Chipset *this_local;
  
  __fd = *cycle->address & 0x1fe;
  if (((cycle->super_MicrocycleOperationStorage<96U>).operation & 4) == 0) {
    uVar1 = CPU::MC68000::Microcycle<96U>::value16(cycle);
    write(this,__fd,(void *)(ulong)uVar1,1);
  }
  else {
    sVar2 = read(this,__fd,(void *)0x1,in_RCX);
    CPU::MC68000::Microcycle<96U>::set_value16(cycle,(uint16_t)sVar2);
  }
  return;
}

Assistant:

void perform(const Microcycle &cycle) {
			const uint32_t register_address = *cycle.address & ChipsetAddressMask;
			if(cycle.operation & CPU::MC68000::Operation::Read) {
				cycle.set_value16(read(register_address));
			} else {
				write(register_address, cycle.value16());
			}
		}